

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
Compiler::processIF(Compiler *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *line)

{
  size_type sVar1;
  const_reference pvVar2;
  string local_38 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *line_local;
  Compiler *this_local;
  
  local_18 = line;
  line_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  Scope::reset(&this->expectedScopeType);
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->bytecode);
  (this->expectedScopeType).bytecodeSizeBefore = (uint)sVar1;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->bytecode);
  (this->expectedScopeType).statementPos = (uint)sVar1;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,1);
  std::__cxx11::string::string(local_38,(string *)pvVar2);
  evaluateBracket(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  InstructionGenerator::genConditionalIf(&this->igen,0);
  (this->expectedScopeType).type = IF;
  return;
}

Assistant:

void Compiler::processIF(const std::vector<std::string>& line)
{
    //Reset the expected scope
    expectedScopeType.reset();

    //Store the bytecode size before the statement
    expectedScopeType.bytecodeSizeBefore = bytecode.size();

    //And the other stuff
    expectedScopeType.statementPos = bytecode.size();
    evaluateBracket(line[1]);
    igen.genConditionalIf(0); //Skip pos will be set later once the scope end point is known
    expectedScopeType.type = Scope::IF;
}